

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::addPositionTarget
          (InverseKinematics *this,string *frameName,Span<const_double,__1L> targetValue,
          double positionWeight)

{
  Position aPStack_18 [24];
  
  if (targetValue.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    iDynTree::Position::Position(aPStack_18,3,targetValue.storage_.data_);
    missingIpoptErrorReport();
  }
  else {
    iDynTree::reportError("InverseKinematics","addPositionTarget","Wrong size in input targetValue")
    ;
  }
  return false;
}

Assistant:

bool InverseKinematics::addPositionTarget(const std::string& frameName,
                                              iDynTree::Span<const double> targetValue,
                                              const double positionWeight)
    {
        constexpr int expected_pos_size = 3;
        bool ok = (targetValue.size() == expected_pos_size);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "addPositionTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->addPositionTarget(frameName, Position(targetValue), positionWeight);
    }